

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O1

void benchmark::ColorPrintf(LogColor color,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_d8;
  void **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_c8 = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d0 = &args[0].overflow_arg_area;
  local_d8 = 0x3000000010;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (!FLAGS_color_print) {
    vprintf(fmt,&local_d8);
    return;
  }
  switch(color) {
  case COLOR_RED:
    pcVar2 = "1";
    break;
  case COLOR_GREEN:
    pcVar2 = "2";
    break;
  case COLOR_YELLOW:
    pcVar2 = "3";
    break;
  case COLOR_BLUE:
    pcVar2 = "4";
    break;
  case COLOR_MAGENTA:
    pcVar2 = "5";
    break;
  case COLOR_CYAN:
    pcVar2 = "6";
    break;
  case COLOR_WHITE:
    pcVar2 = "7";
    break;
  default:
    bVar1 = true;
    pcVar2 = (char *)0x0;
    goto LAB_0011d87c;
  }
  bVar1 = false;
LAB_0011d87c:
  if (!bVar1) {
    fprintf(_stdout,"\x1b[0;3%sm",pcVar2);
  }
  vprintf(fmt,&local_d8);
  printf("\x1b[m");
  return;
}

Assistant:

void ColorPrintf(LogColor color, const char* fmt, ...) {
  va_list args;
  va_start(args, fmt);

  if (!FLAGS_color_print) {
    vprintf(fmt, args);
    va_end(args);
    return;
  }

#ifdef BENCHMARK_OS_WINDOWS
  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle,
                          GetPlatformColorCode(color) | FOREGROUND_INTENSITY);
  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  const char* color_code = GetPlatformColorCode(color);
  if (color_code) fprintf(stdout, "\033[0;3%sm", color_code);
  vprintf(fmt, args);
  printf("\033[m");  // Resets the terminal to default.
#endif
  va_end(args);
}